

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

void pac_dalloc_impl(tsdn_t *tsdn,pai_t *self,edata_t *edata,_Bool *deferred_work_generated)

{
  ehooks_t *ehooks;
  
  ehooks = pac_ehooks_get((pac_t *)self);
  if ((edata->e_bits & 0x11000) == 0x10000) {
    duckdb_je_san_unguard_pages(tsdn,ehooks,edata,(emap_t *)self[0x412].dalloc,true,true);
  }
  duckdb_je_ecache_dalloc(tsdn,(pac_t *)self,ehooks,(ecache_t *)(self + 1),edata);
  *deferred_work_generated = true;
  return;
}

Assistant:

static void
pac_dalloc_impl(tsdn_t *tsdn, pai_t *self, edata_t *edata,
    bool *deferred_work_generated) {
	pac_t *pac = (pac_t *)self;
	ehooks_t *ehooks = pac_ehooks_get(pac);

	if (edata_guarded_get(edata)) {
		/*
		 * Because cached guarded extents do exact fit only, large
		 * guarded extents are restored on dalloc eagerly (otherwise
		 * they will not be reused efficiently).  Slab sizes have a
		 * limited number of size classes, and tend to cycle faster.
		 *
		 * In the case where coalesce is restrained (VirtualFree on
		 * Windows), guarded extents are also not cached -- otherwise
		 * during arena destroy / reset, the retained extents would not
		 * be whole regions (i.e. they are split between regular and
		 * guarded).
		 */
		if (!edata_slab_get(edata) || !maps_coalesce) {
			assert(edata_size_get(edata) >= SC_LARGE_MINCLASS ||
			    !maps_coalesce);
			san_unguard_pages_two_sided(tsdn, ehooks, edata,
			    pac->emap);
		}
	}

	ecache_dalloc(tsdn, pac, ehooks, &pac->ecache_dirty, edata);
	/* Purging of deallocated pages is deferred */
	*deferred_work_generated = true;
}